

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void do_crop_ext_reflect(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                        JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
                        jvirt_barray_ptr *dst_coef_arrays)

{
  JBLOCKROW paJVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  jpeg_component_info *pjVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  JBLOCKARRAY ppaJVar16;
  jpeg_memory_mgr *pjVar17;
  JBLOCKARRAY ppaJVar18;
  int iVar19;
  ulong uVar20;
  JBLOCKROW paJVar21;
  uint uVar22;
  JBLOCKROW paJVar23;
  uint num_blocks;
  jvirt_barray_ptr pjVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  undefined4 uVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  
  uVar2 = srcinfo->output_width;
  iVar19 = dstinfo->num_components;
  iVar3 = dstinfo->max_h_samp_factor;
  if (0 < iVar19) {
    uVar4 = srcinfo->output_height;
    iVar5 = dstinfo->max_v_samp_factor;
    lVar28 = 0;
    do {
      pjVar7 = dstinfo->comp_info;
      if (pjVar7[lVar28].height_in_blocks != 0) {
        uVar6 = pjVar7[lVar28].v_samp_factor;
        uVar20 = (ulong)uVar6;
        num_blocks = pjVar7[lVar28].h_samp_factor * (uVar2 / (uint)(iVar3 << 3));
        uVar26 = pjVar7[lVar28].h_samp_factor * x_crop_offset;
        uVar13 = uVar6 * y_crop_offset;
        uVar22 = 0;
        do {
          ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,dst_coef_arrays[lVar28],uVar22,
                                 (JDIMENSION)uVar20,1);
          if (srcinfo->output_height < dstinfo->image_height) {
            if ((uVar13 <= uVar22) &&
               (uVar22 < uVar6 * (uVar4 / (uint)(iVar5 << 3) + y_crop_offset))) {
              pjVar17 = srcinfo->mem;
              pjVar24 = src_coef_arrays[lVar28];
              uVar15 = -uVar13;
              goto LAB_00113803;
            }
            uVar20 = (ulong)(uint)pjVar7[lVar28].v_samp_factor;
            if (0 < pjVar7[lVar28].v_samp_factor) {
              lVar27 = 0;
              do {
                memset(ppaJVar16[lVar27],0,(ulong)pjVar7[lVar28].width_in_blocks << 7);
                lVar27 = lVar27 + 1;
                uVar20 = (ulong)pjVar7[lVar28].v_samp_factor;
              } while (lVar27 < (long)uVar20);
            }
          }
          else {
            pjVar17 = srcinfo->mem;
            pjVar24 = src_coef_arrays[lVar28];
            uVar15 = uVar13;
LAB_00113803:
            ppaJVar18 = (*pjVar17->access_virt_barray)
                                  ((j_common_ptr)srcinfo,pjVar24,uVar22 + uVar15,
                                   pjVar7[lVar28].v_samp_factor,0);
            auVar35._8_8_ = extraout_XMM1_Qb;
            auVar35._0_8_ = extraout_XMM1_Qa;
            uVar20 = (ulong)(uint)pjVar7[lVar28].v_samp_factor;
            if (0 < pjVar7[lVar28].v_samp_factor) {
              lVar27 = 0;
              do {
                jcopy_block_row(ppaJVar18[lVar27],ppaJVar16[lVar27] + uVar26,num_blocks);
                if (uVar26 != 0) {
                  paJVar21 = ppaJVar16[lVar27] + uVar26;
                  uVar15 = num_blocks;
                  paJVar23 = paJVar21;
                  uVar14 = uVar26;
                  uVar12 = num_blocks;
joined_r0x0011385d:
                  do {
                    if (uVar12 != 0) {
                      paJVar1 = paJVar21 + -1;
                      lVar25 = -0x20;
                      do {
                        auVar29 = *(undefined1 (*) [16])(paJVar23[1] + lVar25 * 2);
                        auVar35 = pshuflw(auVar35,auVar29,0xe7);
                        auVar35 = pshufhw(auVar35,auVar35,0xe7);
                        auVar36._0_4_ = auVar35._0_4_;
                        auVar36._8_4_ = auVar35._8_4_;
                        auVar36._12_4_ = auVar35._12_4_;
                        auVar36._4_4_ = auVar36._8_4_;
                        auVar35 = pshuflw(auVar36,auVar36,0xb1);
                        auVar29 = pshuflw(auVar29,auVar29,0xe8);
                        auVar29 = pshufhw(auVar29,auVar29,0xe8);
                        uVar34 = auVar29._8_4_;
                        auVar31._0_10_ = (unkuint10)CONCAT44(uVar34,uVar34) << 0x20;
                        auVar10._8_2_ = auVar29._10_2_;
                        auVar10._0_8_ = CONCAT44(uVar34,uVar34);
                        auVar10._10_2_ = -auVar35._6_2_;
                        auVar31._12_4_ = auVar10._8_4_;
                        auVar31._10_2_ = -auVar35._4_2_;
                        auVar8._4_2_ = auVar29._8_2_;
                        auVar8._0_4_ = uVar34;
                        auVar8._6_6_ = auVar31._10_6_;
                        auVar30._8_8_ = auVar8._4_8_;
                        auVar30._6_2_ = -auVar35._2_2_;
                        auVar30._4_2_ = auVar29._2_2_;
                        auVar30._0_2_ = auVar29._0_2_;
                        auVar30._2_2_ = -auVar35._0_2_;
                        *(undefined1 (*) [16])(*paJVar21 + lVar25 * 2) = auVar30;
                        lVar25 = lVar25 + 4;
                      } while (lVar25 != 0);
                      uVar14 = uVar14 - 1;
                      paJVar21 = paJVar1;
                      if (uVar15 - 1 != 0) {
                        uVar15 = uVar15 - 1;
                        paJVar23 = paJVar23 + 1;
                        uVar12 = uVar14;
                        goto joined_r0x0011385d;
                      }
                    }
                    uVar15 = num_blocks;
                    paJVar23 = paJVar21;
                    uVar12 = num_blocks;
                  } while (uVar14 != 0);
                }
                uVar15 = pjVar7[lVar28].width_in_blocks - (uVar26 + num_blocks);
                if ((uVar26 + num_blocks <= pjVar7[lVar28].width_in_blocks && uVar15 != 0) &&
                   (uVar15 != 0)) {
                  paJVar23 = ppaJVar16[lVar27] + (ulong)uVar26 + (ulong)num_blocks;
                  uVar14 = num_blocks;
                  paJVar21 = paJVar23;
                  uVar12 = num_blocks;
joined_r0x001138e9:
                  do {
                    if (uVar12 != 0) {
                      lVar25 = -0x20;
                      do {
                        auVar29 = *(undefined1 (*) [16])(*paJVar21 + lVar25 * 2);
                        auVar35 = pshuflw(auVar35,auVar29,0xe7);
                        auVar35 = pshufhw(auVar35,auVar35,0xe7);
                        auVar37._0_4_ = auVar35._0_4_;
                        auVar37._8_4_ = auVar35._8_4_;
                        auVar37._12_4_ = auVar35._12_4_;
                        auVar37._4_4_ = auVar37._8_4_;
                        auVar35 = pshuflw(auVar37,auVar37,0xb1);
                        auVar29 = pshuflw(auVar29,auVar29,0xe8);
                        auVar29 = pshufhw(auVar29,auVar29,0xe8);
                        uVar34 = auVar29._8_4_;
                        auVar33._0_10_ = (unkuint10)CONCAT44(uVar34,uVar34) << 0x20;
                        auVar11._8_2_ = auVar29._10_2_;
                        auVar11._0_8_ = CONCAT44(uVar34,uVar34);
                        auVar11._10_2_ = -auVar35._6_2_;
                        auVar33._12_4_ = auVar11._8_4_;
                        auVar33._10_2_ = -auVar35._4_2_;
                        auVar9._4_2_ = auVar29._8_2_;
                        auVar9._0_4_ = uVar34;
                        auVar9._6_6_ = auVar33._10_6_;
                        auVar32._8_8_ = auVar9._4_8_;
                        auVar32._6_2_ = -auVar35._2_2_;
                        auVar32._4_2_ = auVar29._2_2_;
                        auVar32._0_2_ = auVar29._0_2_;
                        auVar32._2_2_ = -auVar35._0_2_;
                        *(undefined1 (*) [16])(paJVar23[1] + lVar25 * 2) = auVar32;
                        lVar25 = lVar25 + 4;
                      } while (lVar25 != 0);
                      paJVar23 = paJVar23 + 1;
                      uVar15 = uVar15 - 1;
                      uVar14 = uVar14 - 1;
                      paJVar21 = paJVar21 + -1;
                      uVar12 = uVar15;
                      if (uVar14 != 0) goto joined_r0x001138e9;
                    }
                    uVar14 = num_blocks;
                    paJVar21 = paJVar23;
                    uVar12 = num_blocks;
                  } while (uVar15 != 0);
                }
                lVar27 = lVar27 + 1;
                uVar20 = (ulong)pjVar7[lVar28].v_samp_factor;
              } while (lVar27 < (long)uVar20);
            }
          }
          uVar22 = uVar22 + (int)uVar20;
        } while (uVar22 < pjVar7[lVar28].height_in_blocks);
        iVar19 = dstinfo->num_components;
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < iVar19);
  }
  return;
}

Assistant:

LOCAL(void)
do_crop_ext_reflect(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                    JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
                    jvirt_barray_ptr *src_coef_arrays,
                    jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop.
 * Extension: The destination width is larger than the source, and we fill in
 * the expanded region with repeated reflections of the source image.  Note
 * that we also have to fill partial iMCUs at the right and bottom edge of the
 * source image area in this case.
 */
{
  JDIMENSION MCU_cols, MCU_rows, comp_width, comp_height, src_blk_x;
  JDIMENSION dst_blk_x, dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, k, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  JBLOCKROW src_row_ptr, dst_row_ptr;
  JCOEFPTR src_ptr, dst_ptr;
  jpeg_component_info *compptr;

  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);
  MCU_rows = srcinfo->output_height /
             (dstinfo->max_v_samp_factor * dstinfo_min_DCT_v_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    comp_height = MCU_rows * compptr->v_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      if (dstinfo->_jpeg_height > srcinfo->output_height) {
        if (dst_blk_y < y_crop_blocks ||
            dst_blk_y >= y_crop_blocks + comp_height) {
          for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
            MEMZERO(dst_buffer[offset_y],
                    compptr->width_in_blocks * sizeof(JBLOCK));
          }
          continue;
        }
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y - y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      } else {
        src_buffer = (*srcinfo->mem->access_virt_barray)
          ((j_common_ptr)srcinfo, src_coef_arrays[ci],
           dst_blk_y + y_crop_blocks, (JDIMENSION)compptr->v_samp_factor,
           FALSE);
      }
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        /* Copy source region */
        jcopy_block_row(src_buffer[offset_y],
                        dst_buffer[offset_y] + x_crop_blocks, comp_width);
        if (x_crop_blocks > 0) {
          /* Reflect to left */
          dst_row_ptr = dst_buffer[offset_y] + x_crop_blocks;
          for (dst_blk_x = x_crop_blocks; dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;      /* (re)set axis of reflection */
            for (src_blk_x = comp_width; src_blk_x > 0 && dst_blk_x > 0;
                 src_blk_x--, dst_blk_x--) {
              dst_ptr = *(--dst_row_ptr);   /* destination goes left */
              src_ptr = *src_row_ptr++;     /* source goes right */
              /* This unrolled loop doesn't need to know which row it's on. */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;    /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign
                                               change */
              }
            }
          }
        }
        if (compptr->width_in_blocks > x_crop_blocks + comp_width) {
          /* Reflect to right */
          dst_row_ptr = dst_buffer[offset_y] + x_crop_blocks + comp_width;
          for (dst_blk_x = compptr->width_in_blocks - x_crop_blocks - comp_width;
               dst_blk_x > 0;) {
            src_row_ptr = dst_row_ptr;      /* (re)set axis of reflection */
            for (src_blk_x = comp_width; src_blk_x > 0 && dst_blk_x > 0;
                 src_blk_x--, dst_blk_x--) {
              dst_ptr = *dst_row_ptr++;     /* destination goes right */
              src_ptr = *(--src_row_ptr);   /* source goes left */
              /* This unrolled loop doesn't need to know which row it's on. */
              for (k = 0; k < DCTSIZE2; k += 2) {
                *dst_ptr++ = *src_ptr++;    /* copy even column */
                *dst_ptr++ = -(*src_ptr++); /* copy odd column with sign
                                               change */
              }
            }
          }
        }
      }
    }
  }
}